

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Scene::triangulateSelection(Scene *this)

{
  SceneObject *pSVar1;
  long lVar2;
  
  pSVar1 = (this->selected).object;
  if (pSVar1 != (SceneObject *)0x0) {
    lVar2 = __dynamic_cast(pSVar1,&SceneObject::typeinfo,&Mesh::typeinfo,0);
    if (lVar2 != 0) {
      HalfedgeMesh::triangulate((HalfedgeMesh *)(lVar2 + 0xf0));
      clearSelections(this);
      return;
    }
  }
  return;
}

Assistant:

void Scene::triangulateSelection()
{
   Mesh* mesh = dynamic_cast<Mesh*>( selected.object );
   if( mesh )
   {
      mesh->mesh.triangulate();
      clearSelections();
   }
}